

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

shared_ptr<kratos::InterfaceRef> __thiscall
kratos::InterfaceRef::get_modport_ref(InterfaceRef *this,string *name)

{
  string *psVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  element_type *peVar7;
  UserException *pUVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
  *pmVar9;
  undefined4 extraout_var;
  mapped_type *pmVar10;
  element_type *peVar11;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar12;
  element_type *port_00;
  element_type *peVar13;
  Port *port_01;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::InterfaceRef> sVar15;
  format_args args;
  format_args args_00;
  string_view format_str;
  string_view format_str_00;
  InterfaceDefinition *local_318;
  Var *local_2c8;
  Var *local_2c0;
  undefined1 local_2b8 [8];
  shared_ptr<kratos::ModportPort> port;
  _Self local_2a0;
  undefined1 local_291;
  reference pbStack_290;
  bool is_input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  undefined1 local_218 [8];
  mapped_type modport_def;
  string local_200;
  _Self local_1e0;
  _Self local_1d8;
  undefined1 local_1d0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
  modports;
  allocator<char> local_189;
  string local_188;
  InterfaceDefinition *local_168;
  InterfaceDefinition *definition;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_true>
  local_158;
  key_type *local_150;
  string *name_local;
  InterfaceRef *this_local;
  shared_ptr<kratos::InterfaceRef> *new_ref;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_130;
  basic_string_view<char> local_128;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_f0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  key_type *local_e0;
  char *local_d8;
  string *local_d0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_c8;
  basic_string_view<char> local_b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_80;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_70;
  char *local_68;
  size_t *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  local_150 = in_RDX;
  name_local = name;
  this_local = this;
  local_158._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
               *)((long)&name[5].field_2 + 8),in_RDX);
  definition = (InterfaceDefinition *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
                      *)((long)&name[5].field_2 + 8));
  bVar2 = std::__detail::operator!=
                    (&local_158,
                     (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>,_true>
                      *)&definition);
  if (bVar2) {
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
             ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceRef>_>_>_>
                   *)((long)&name[5].field_2 + 8),local_150);
    std::shared_ptr<kratos::InterfaceRef>::shared_ptr
              ((shared_ptr<kratos::InterfaceRef> *)this,pmVar5);
    _Var14._M_pi = extraout_RDX;
  }
  else {
    peVar6 = std::__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2> *)name);
    if (peVar6 == (element_type *)0x0) {
      local_318 = (InterfaceDefinition *)0x0;
    }
    else {
      local_318 = (InterfaceDefinition *)
                  __dynamic_cast(peVar6,&IDefinition::typeinfo,&InterfaceDefinition::typeinfo,0);
    }
    local_168 = local_318;
    peVar7 = std::__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)name);
    uVar3 = (*peVar7->_vptr_IDefinition[8])();
    if (((uVar3 & 1) != 0) || (local_168 == (InterfaceDefinition *)0x0)) {
      modports._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
      pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"Cannot create modport from a modport interface",&local_189);
      UserException::UserException(pUVar8,&local_188);
      modports._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
      __cxa_throw(pUVar8,&UserException::typeinfo,UserException::~UserException);
    }
    pmVar9 = InterfaceDefinition::mod_ports_abi_cxx11_(local_168);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
           *)local_1d0,pmVar9);
    local_1d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                 *)local_1d0,local_150);
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                *)local_1d0);
    bVar2 = std::operator==(&local_1d8,&local_1e0);
    if (bVar2) {
      modport_def.super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._7_1_ = 1;
      pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
      iVar4 = (*(local_168->super_IDefinition)._vptr_IDefinition[6])();
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)CONCAT44(extraout_var,iVar4);
      local_d0 = &local_200;
      local_d8 = "Unable to find modport {0} from {1}";
      local_e0 = local_150;
      fmt::v7::
      make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[36],char>
                (&local_118,(v7 *)"Unable to find modport {0} from {1}",(char (*) [36])local_150,
                 (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,in_R8);
      local_f0 = &local_118;
      local_128 = fmt::v7::to_string_view<char,_0>(local_d8);
      local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&new_ref;
      local_58 = local_f0;
      local_48 = local_f0;
      local_38 = local_f0;
      local_40 = local_50;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_f0);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_130.values_;
      format_str.size_ = (size_t)new_ref;
      format_str.data_ = (char *)local_128.size_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_200,(detail *)local_128.data_,format_str,args);
      UserException::UserException(pUVar8,&local_200);
      modport_def.super___shared_ptr<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._7_1_ = 0;
      __cxa_throw(pUVar8,&UserException::typeinfo,UserException::~UserException);
    }
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
              ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
                    *)local_1d0,local_150);
    std::shared_ptr<kratos::InterfaceModPortDefinition>::shared_ptr
              ((shared_ptr<kratos::InterfaceModPortDefinition> *)local_218,pmVar10);
    local_70 = &name[4].field_2;
    local_60 = &ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_68 = "{0}.{1}";
    vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_150;
    fmt::v7::make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,char[8],char>
              (&local_a8,(v7 *)0x455f13,(char (*) [8])&local_70->_M_allocated_capacity,local_150,
               in_R8);
    local_80 = &local_a8;
    local_b8 = fmt::v7::to_string_view<char,_0>(local_68);
    local_28 = &local_c8;
    local_30 = local_80;
    local_20 = local_80;
    local_10 = local_80;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_80);
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_c8.field_1.values_;
    format_str_00.size_ = local_c8.desc_;
    format_str_00.data_ = (char *)local_b8.size_;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (detail *)local_b8.data_,format_str_00,args_00);
    std::
    make_shared<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceModPortDefinition>&,kratos::Generator*&,std::__cxx11::string>
              ((shared_ptr<kratos::InterfaceModPortDefinition> *)this,(Generator **)local_218,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &name[4]._M_string_length);
    std::__cxx11::string::~string((string *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    peVar11 = std::
              __shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_218);
    (*(peVar11->super_IDefinition)._vptr_IDefinition[4])(&__range1);
    __end1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1);
    port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
    while( true ) {
      bVar2 = std::operator!=(&__end1,(_Self *)&port_name);
      if (!bVar2) break;
      pbStack_290 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end1);
      peVar11 = std::
                __shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_218);
      psVar12 = InterfaceModPortDefinition::inputs_abi_cxx11_(peVar11);
      local_2a0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar12,local_150);
      peVar11 = std::
                __shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::InterfaceModPortDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_218);
      psVar12 = InterfaceModPortDefinition::inputs_abi_cxx11_(peVar11);
      port.super___shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(psVar12);
      local_291 = std::operator!=(&local_2a0,
                                  (_Self *)&port.
                                            super___shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
      bVar2 = has_var((InterfaceRef *)name,pbStack_290);
      if (bVar2) {
        local_2c0 = (Var *)std::__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>::get
                                     ((__shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>
                                       *)this);
        local_2c8 = var((InterfaceRef *)name,pbStack_290);
        std::
        make_shared<kratos::ModportPort,kratos::InterfaceRef*,kratos::Var*,kratos::PortDirection>
                  ((InterfaceRef **)local_2b8,&local_2c0,(PortDirection *)&local_2c8);
        peVar13 = std::
                  __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        std::
        unordered_map<std::__cxx11::string,std::shared_ptr<kratos::ModportPort>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::ModportPort>>>>
        ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::ModportPort>&>
                  ((unordered_map<std::__cxx11::string,std::shared_ptr<kratos::ModportPort>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::ModportPort>>>>
                    *)&peVar13->modport_ports_,pbStack_290,
                   (shared_ptr<kratos::ModportPort> *)local_2b8);
        peVar13 = std::
                  __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        psVar1 = pbStack_290;
        port_00 = std::__shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::ModportPort,_(__gnu_cxx::_Lock_policy)2> *)
                             local_2b8);
        InterfaceRef::port(peVar13,psVar1,(Port *)port_00);
        std::shared_ptr<kratos::ModportPort>::~shared_ptr
                  ((shared_ptr<kratos::ModportPort> *)local_2b8);
      }
      else {
        peVar13 = std::
                  __shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)this);
        psVar1 = pbStack_290;
        port_01 = InterfaceRef::port((InterfaceRef *)name,pbStack_290);
        InterfaceRef::port(peVar13,psVar1,port_01);
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    std::
    unordered_map<std::__cxx11::string,std::shared_ptr<kratos::InterfaceRef>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::InterfaceRef>&>
              ((unordered_map<std::__cxx11::string,std::shared_ptr<kratos::InterfaceRef>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::InterfaceRef>>>>
                *)(name[5].field_2._M_local_buf + 8),local_150,
               (shared_ptr<kratos::InterfaceRef> *)this);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
    std::shared_ptr<kratos::InterfaceModPortDefinition>::~shared_ptr
              ((shared_ptr<kratos::InterfaceModPortDefinition> *)local_218);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>_>_>
            *)local_1d0);
    _Var14._M_pi = extraout_RDX_00;
  }
  sVar15.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  sVar15.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::InterfaceRef>)
         sVar15.super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<InterfaceRef> InterfaceRef::get_modport_ref(const std::string& name) {
    if (mod_ports_.find(name) != mod_ports_.end()) return mod_ports_.at(name);
    auto* definition = dynamic_cast<InterfaceDefinition*>(definition_.get());
    if (definition_->is_modport() || !definition) {
        throw UserException("Cannot create modport from a modport interface");
    }
    auto modports = definition->mod_ports();
    if (modports.find(name) == modports.end())
        throw UserException(
            ::format("Unable to find modport {0} from {1}", name, definition->name()));
    auto modport_def = modports.at(name);
    auto new_ref =
        std::make_shared<InterfaceRef>(modport_def, gen_, ::format("{0}.{1}", name_, name));
    // pass through the variable reference
    // since it's modport, it can only be ports
    auto ports = modport_def->ports();
    for (auto const& port_name : ports) {
        bool is_input = modport_def->inputs().find(name) != modport_def->inputs().end();
        if (has_var(port_name)) {
            // it's a variable
            auto port = std::make_shared<ModportPort>(
                new_ref.get(), &var(port_name), is_input ? PortDirection::In : PortDirection::Out);
            new_ref->modport_ports_.emplace(port_name, port);
            new_ref->port(port_name, port.get());
        } else {
            new_ref->port(port_name, &port(port_name));
        }
    }
    mod_ports_.emplace(name, new_ref);
    return new_ref;
}